

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

uint64_t get_uintX(uint8_t *p,int length)

{
  uint64_t local_20;
  uint64_t value;
  byte *pbStack_10;
  int length_local;
  uint8_t *p_local;
  
  local_20 = 0;
  value._4_4_ = length;
  pbStack_10 = p;
  while (0 < value._4_4_) {
    local_20 = (ulong)*pbStack_10 + local_20 * 0x100;
    value._4_4_ = value._4_4_ + -1;
    pbStack_10 = pbStack_10 + 1;
  }
  return local_20;
}

Assistant:

static uint64_t get_uintX(const uint8_t *p, int length) {
    uint64_t value = 0;
    while (length-- > 0) {
        value <<= 8;
        value += *p++;
    }
    return value;
}